

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bridge.cpp
# Opt level: O1

Belief * __thiscall despot::Bridge::Tau(Bridge *this,Belief *belief,ACT_TYPE action,OBS_TYPE obs)

{
  long lVar1;
  long lVar2;
  int iVar3;
  pointer pdVar4;
  int iVar5;
  long *plVar6;
  long lVar7;
  ParticleBelief *pPVar8;
  int iVar9;
  long lVar10;
  int iVar11;
  ulong uVar12;
  double dVar13;
  double dVar14;
  double dVar15;
  vector<despot::State_*,_std::allocator<despot::State_*>_> new_particles;
  vector<despot::State_*,_std::allocator<despot::State_*>_> local_68;
  double local_50;
  vector<despot::State_*,_std::allocator<despot::State_*>_> local_48;
  State *local_30;
  
  if (Tau(despot::Belief_const*,int,unsigned_long)::probs == '\0') {
    iVar5 = __cxa_guard_acquire(&Tau(despot::Belief_const*,int,unsigned_long)::probs);
    if (iVar5 != 0) {
      std::vector<double,_std::allocator<double>_>::vector
                (&Tau::probs,(long)BRIDGELENGTH,(allocator_type *)&local_68);
      __cxa_atexit(std::vector<double,_std::allocator<double>_>::~vector,&Tau::probs,&__dso_handle);
      __cxa_guard_release(&Tau(despot::Belief_const*,int,unsigned_long)::probs);
    }
  }
  plVar6 = (long *)(**(code **)(*(long *)belief + 0x30))(belief);
  pdVar4 = Tau::probs.super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  iVar3 = LEFT;
  iVar5 = RIGHT;
  lVar1 = *plVar6;
  lVar7 = plVar6[1] - lVar1;
  if (lVar7 == 0) {
    dVar15 = 0.0;
  }
  else {
    lVar7 = lVar7 >> 3;
    dVar15 = 0.0;
    if (obs == 1) {
      dVar13 = 1.0;
    }
    else {
      dVar13 = 0.0;
    }
    iVar9 = BRIDGELENGTH + -1;
    lVar10 = 0;
    do {
      lVar2 = *(long *)(lVar1 + lVar10 * 8);
      iVar11 = *(int *)(lVar2 + 0x20);
      if (iVar3 == action) {
        if (iVar11 < 2) {
          iVar11 = 1;
        }
        iVar11 = iVar11 + -1;
LAB_00105cdf:
        dVar14 = *(double *)(lVar2 + 0x18) * dVar13;
        dVar15 = dVar15 + dVar14;
        pdVar4[iVar11] = dVar14 + pdVar4[iVar11];
      }
      else {
        if (iVar5 != action) goto LAB_00105cdf;
        if (iVar11 < iVar9) {
          iVar11 = iVar11 + 1;
          goto LAB_00105cdf;
        }
      }
      lVar10 = lVar10 + 1;
    } while (lVar7 + (ulong)(lVar7 == 0) != lVar10);
  }
  local_68.super__Vector_base<despot::State_*,_std::allocator<despot::State_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_68.super__Vector_base<despot::State_*,_std::allocator<despot::State_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_68.super__Vector_base<despot::State_*,_std::allocator<despot::State_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if (0 < BRIDGELENGTH) {
    uVar12 = 0;
    local_50 = dVar15;
    do {
      if (0.0 < Tau::probs.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_start[uVar12]) {
        local_30 = (State *)(**(code **)(*(long *)this + 0xa8))(0,this,uVar12 & 0xffffffff);
        *(int *)(local_30 + 0x20) = (int)uVar12;
        *(double *)(local_30 + 0x18) =
             Tau::probs.super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start[uVar12] / local_50;
        std::vector<despot::State*,std::allocator<despot::State*>>::emplace_back<despot::State*>
                  ((vector<despot::State*,std::allocator<despot::State*>> *)&local_68,&local_30);
        Tau::probs.super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_start[uVar12] = 0.0;
      }
      uVar12 = uVar12 + 1;
    } while ((long)uVar12 < (long)BRIDGELENGTH);
  }
  pPVar8 = (ParticleBelief *)operator_new(0x90);
  std::vector<despot::State_*,_std::allocator<despot::State_*>_>::vector(&local_48,&local_68);
  despot::ParticleBelief::ParticleBelief(pPVar8,&local_48,this,0,0);
  if (local_48.super__Vector_base<despot::State_*,_std::allocator<despot::State_*>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_48.super__Vector_base<despot::State_*,_std::allocator<despot::State_*>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_48.
                          super__Vector_base<despot::State_*,_std::allocator<despot::State_*>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_48.
                          super__Vector_base<despot::State_*,_std::allocator<despot::State_*>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  if (local_68.super__Vector_base<despot::State_*,_std::allocator<despot::State_*>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_68.super__Vector_base<despot::State_*,_std::allocator<despot::State_*>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_68.
                          super__Vector_base<despot::State_*,_std::allocator<despot::State_*>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_68.
                          super__Vector_base<despot::State_*,_std::allocator<despot::State_*>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  return (Belief *)pPVar8;
}

Assistant:

Belief* Bridge::Tau(const Belief* belief, ACT_TYPE action, OBS_TYPE obs) const {
	static vector<double> probs = vector<double>(NumStates());

	const vector<State*>& particles =
		static_cast<const ParticleBelief*>(belief)->particles();

	double sum = 0;
	for (int i = 0; i < particles.size(); i++) {
		BridgeState* state = static_cast<BridgeState*>(particles[i]);
		int next_pos = state->position;
		if (action == LEFT) {
			next_pos--;
			if (next_pos < 0)
				next_pos = 0;
		} else if (action == RIGHT) {
			if (next_pos < BRIDGELENGTH - 1)
				next_pos++;
			else
				continue;
		}

		double p = state->weight * (obs == 1);
		probs[next_pos] += p;
		sum += p;
	}

	vector<State*> new_particles;
	for (int i = 0; i < NumStates(); i++) {
		if (probs[i] > 0) {
			BridgeState* new_particle = static_cast<BridgeState*>(Allocate(i));
			new_particle->position = i;
			new_particle->weight = probs[i] / sum;
			new_particles.push_back(new_particle);
			probs[i] = 0;
		}
	}

	return new ParticleBelief(new_particles, this, NULL, false);
}